

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_icon2.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ALLEGRO_EVENT event;
  int v;
  int u;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_BITMAP *icons [2];
  ALLEGRO_DISPLAY *display;
  int local_a0 [8];
  int local_80;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  undefined8 local_30;
  long local_28;
  undefined8 local_20;
  long local_18;
  undefined4 local_4;
  
  local_4 = 0;
  uVar3 = al_install_system(0x85020700,atexit);
  if ((uVar3 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_install_keyboard();
  al_init_image_addon();
  init_platform_specific();
  local_28 = al_load_bitmap("data/cursor.tga");
  if (local_28 == 0) {
    abort_example("icons.tga not found\n");
  }
  al_x_set_initial_icon(local_28);
  local_18 = al_create_display(0x140,200);
  if (local_18 == 0) {
    abort_example("Error creating display\n");
  }
  uVar4 = 0;
  local_48 = al_map_rgb_f(0);
  local_40 = uVar4;
  al_clear_to_color(local_48,uVar4);
  al_flip_display();
  al_set_new_bitmap_flags(1);
  local_20 = al_create_bitmap(0x20);
  al_set_target_bitmap(local_20);
  for (local_38 = 0; local_38 < 0x20; local_38 = local_38 + 1) {
    for (local_34 = 0; iVar2 = local_34, iVar1 = local_38, local_34 < 0x20; local_34 = local_34 + 1)
    {
      uVar4 = CONCAT44((int)((ulong)((double)local_38 / 31.0) >> 0x20),
                       (float)((double)local_38 / 31.0));
      local_58 = al_map_rgb_f(CONCAT44((int)((ulong)((double)local_34 / 31.0) >> 0x20),
                                       (float)((double)local_34 / 31.0)),uVar4,0x3f800000);
      local_50 = uVar4;
      al_put_pixel(local_58,uVar4,iVar2,iVar1);
    }
  }
  al_set_target_backbuffer(local_18);
  al_set_display_icons(local_18,2,&local_28);
  uVar4 = al_create_event_queue();
  local_30 = uVar4;
  uVar5 = al_get_keyboard_event_source();
  al_register_event_source(uVar4,uVar5);
  uVar4 = local_30;
  uVar5 = al_get_display_event_source(local_18);
  al_register_event_source(uVar4,uVar5);
  do {
    al_wait_for_event(local_30,local_a0);
    if ((local_a0[0] == 10) && (local_80 == 0x3b)) break;
  } while (local_a0[0] != 0x2a);
  al_uninstall_system();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *icons[NUM_ICONS];
   ALLEGRO_EVENT_QUEUE *queue;
   int u, v;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_install_keyboard();
   al_init_image_addon();
   init_platform_specific();

   /* First icon 16x16: Read from file. */
   icons[0] = al_load_bitmap("data/cursor.tga");
   if (!icons[0]) {
      abort_example("icons.tga not found\n");
   }

#if defined(ALLEGRO_UNIX) && !defined(ALLEGRO_RASPBERRYPI)
   al_x_set_initial_icon(icons[0]);
#endif

   display = al_create_display(320, 200);
   if (!display) {
      abort_example("Error creating display\n");
   }
   al_clear_to_color(al_map_rgb_f(0, 0, 0));
   al_flip_display();

   /* Second icon 32x32: Create it. */
   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   icons[1] = al_create_bitmap(32, 32);
   al_set_target_bitmap(icons[1]);
   for (v = 0; v < 32; v++) {
      for (u = 0; u < 32; u++) {
         al_put_pixel(u, v, al_map_rgb_f(u / 31.0, v / 31.0, 1));
      }
   }
   al_set_target_backbuffer(display);

   al_set_display_icons(display, NUM_ICONS, icons);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));

   for (;;) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);

      if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
            event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
   }

   al_uninstall_system();

   return 0;
}